

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,int count,ON_Layer *a)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  if (a == (ON_Layer *)0x0) {
    uVar3 = 0;
  }
  bVar1 = WriteInt(this,(ON__INT32)uVar3);
  while ((uVar2 < uVar3 && (bVar1 != false))) {
    bVar1 = WriteObject(this,(ON_Object *)a);
    uVar2 = uVar2 + 1;
    a = a + 1;
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::WriteArray( int count, const ON_Layer* a)
{
  int i;
  if ( count < 0 || 0 == a )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    rc = WriteObject(a[i]);
  }
  return rc;
}